

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.hpp
# Opt level: O2

void __thiscall bf_crc::set_crc_width(bf_crc *this,uint16_t var)

{
  this->crc_width_ = var;
  update_test_vector_count(this);
  this->polynomial_range_ = false;
  this->polynomial_start_ = 0;
  this->polynomial_end_ = ~(uint)(-1L << ((byte)this->crc_width_ & 0x3f));
  update_test_vector_count(this);
  return;
}

Assistant:

void set_crc_width(uint16_t var) { 
			crc_width_ = var; 
			update_test_vector_count(); 
			polynomial_range_ = false;
			polynomial_start_ = 0;
			polynomial_end_ = max_value(crc_width_);
			update_test_vector_count();
		}